

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<float_*> * __thiscall
TPZVec<float_*>::operator=(TPZVec<float_*> *this,initializer_list<float_*> *list)

{
  size_type sVar1;
  iterator ppfVar2;
  float **ppfVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  sVar1 = list->_M_len;
  if (sVar1 != 0) {
    ppfVar2 = list->_M_array;
    ppfVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)ppfVar3 + lVar4) = *(undefined8 *)((long)ppfVar2 + lVar4);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}